

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_gpio_function_unexported(APITests *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  GPIO::setmode(BOARD);
  iVar1 = GPIO::gpio_function((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  assert::is_true(iVar1 == 0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GPIO::cleanup();
  return;
}

Assistant:

void test_gpio_function_unexported()
    {
        GPIO::setmode(GPIO::BOARD);
        auto val = GPIO::gpio_function(pin_data.in_a);
        assert::is_true(val == GPIO::Directions::UNKNOWN);
        GPIO::cleanup();
    }